

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_properties.h
# Opt level: O0

ON_3dmApplication * __thiscall
ON_3dmApplication::operator=(ON_3dmApplication *this,ON_3dmApplication *param_1)

{
  ON_3dmApplication *param_1_local;
  ON_3dmApplication *this_local;
  
  ON_wString::operator=(&this->m_application_name,&param_1->m_application_name);
  ON_wString::operator=(&this->m_application_URL,&param_1->m_application_URL);
  ON_wString::operator=(&this->m_application_details,&param_1->m_application_details);
  return this;
}

Assistant:

class ON_CLASS ON_3dmApplication
{
  // application that created the 3dm file
public:
  ON_3dmApplication();
  ~ON_3dmApplication();

  static const ON_3dmApplication Empty;

  bool IsValid() const;

  bool IsEmpty() const;

  bool Read( ON_BinaryArchive& );
  bool Write( ON_BinaryArchive& ) const;

  void Dump( ON_TextLog& ) const;

  ON_wString m_application_name;    // short name like "Rhino 2.0"
  ON_wString m_application_URL;     // URL
  ON_wString m_application_details; // whatever you want
}